

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shproduct.hpp
# Opt level: O3

matrix<225> * __thiscall SH<15>::prodMatrix(matrix<225> *__return_storage_ptr__,SH<15> *this)

{
  pointer pTVar1;
  int iVar2;
  pointer pTVar3;
  
  if (prodMatrix()::SparseGamma == '\0') {
    iVar2 = __cxa_guard_acquire(&prodMatrix()::SparseGamma);
    if (iVar2 != 0) {
      readGamma(&prodMatrix::SparseGamma,0xf);
      __cxa_atexit(std::vector<TensorEntry,_std::allocator<TensorEntry>_>::~vector,
                   &prodMatrix::SparseGamma,&__dso_handle);
      __cxa_guard_release(&prodMatrix()::SparseGamma);
    }
  }
  memset(__return_storage_ptr__,0,0x31704);
  pTVar1 = prodMatrix::SparseGamma.super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar3 = prodMatrix::SparseGamma.
                super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
    __return_storage_ptr__->a[pTVar3->a][pTVar3->b] =
         pTVar3->val * this->a[pTVar3->c] + __return_storage_ptr__->a[pTVar3->a][pTVar3->b];
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<n*n> SH<n>::prodMatrix() const
{
    static std::vector<TensorEntry> SparseGamma = readGamma(n);
    matrix<n*n> m;
    for (auto e: SparseGamma)
    	m.a[e.a][e.b] += e.val * a[e.c];
    return m;
}